

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void xmlHashScanFull(xmlHashTablePtr table,xmlHashScannerFull f,void *data)

{
  int iVar1;
  _xmlHashEntry *p_Var2;
  _xmlHashEntry *p_Var3;
  _xmlHashEntry *p_Var4;
  long lVar5;
  _xmlHashEntry *p_Var6;
  
  if ((f != (xmlHashScannerFull)0x0 && table != (xmlHashTablePtr)0x0) &&
     (table->table != (_xmlHashEntry *)0x0)) {
    for (lVar5 = 0; lVar5 < table->size; lVar5 = lVar5 + 1) {
      if (table->table[lVar5].valid != 0) {
        p_Var3 = table->table + lVar5;
        while (p_Var6 = p_Var3, p_Var6 != (_xmlHashEntry *)0x0) {
          p_Var2 = p_Var6->next;
          p_Var3 = p_Var2;
          if (((p_Var6->payload != (void *)0x0) &&
              (iVar1 = table->nbElems,
              (*f)(p_Var6->payload,data,p_Var6->name,p_Var6->name2,p_Var6->name3),
              iVar1 != table->nbElems)) && (p_Var4 = table->table + lVar5, p_Var6 == p_Var4)) {
            if (p_Var4->valid == 0) {
              p_Var6 = (_xmlHashEntry *)0x0;
            }
            p_Var3 = p_Var6;
            if (p_Var4->next != p_Var2) {
              p_Var3 = p_Var4;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr table, xmlHashScannerFull f, void *data) {
    int i, nb;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
                nb = table->nbElems;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
                if (nb != table->nbElems) {
                    /* table was modified by the callback, be careful */
                    if (iter == &(table->table[i])) {
                        if (table->table[i].valid == 0)
                            iter = NULL;
                        if (table->table[i].next != next)
			    iter = &(table->table[i]);
                    } else
		        iter = next;
                } else
		    iter = next;
	    }
	}
    }
}